

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

void vrna_seq_toRNA(char *sequence)

{
  uint uVar1;
  
  if (sequence == (char *)0x0) {
    return;
  }
  uVar1 = 0;
  do {
    if (sequence[uVar1] == 'T') {
      sequence[uVar1] = 'U';
    }
    else if (sequence[uVar1] == '\0') {
      return;
    }
    if (sequence[uVar1] == 't') {
      sequence[uVar1] = 'u';
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

PUBLIC void
vrna_seq_toRNA(char *sequence)
{
  unsigned int i;

  if (sequence) {
    for (i = 0; sequence[i]; i++) {
      if (sequence[i] == 'T')
        sequence[i] = 'U';

      if (sequence[i] == 't')
        sequence[i] = 'u';
    }
  }
}